

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monotone.c
# Opt level: O1

Aig_Man_t *
createMonotoneTester
          (Aig_Man_t *pAig,aigPoIndices *aigPoIndicesArg,monotoneVectorsStruct *monotoneVectorArg,
          int *startMonotonePropPo)

{
  uint *puVar1;
  uint *puVar2;
  long lVar3;
  Vec_Int_t *vKnownMonotone;
  Vec_Int_t *vCandMonotone;
  Vec_Int_t *vHintMonotone;
  Aig_Obj_t *p1;
  uint uVar4;
  Aig_Man_t *p;
  size_t sVar5;
  char *__s;
  Aig_Obj_t *pAVar6;
  uint *puVar7;
  void *pvVar8;
  Aig_Obj_t *pAVar9;
  Vec_Ptr_t *pVVar10;
  ulong uVar11;
  Aig_Obj_t *p0;
  uint *puVar12;
  uint *puVar13;
  uint *puVar14;
  ulong uVar15;
  uint uVar16;
  uint *puVar17;
  Aig_Obj_t *pAVar18;
  uint *puVar19;
  uint *puVar20;
  long lVar21;
  uint uVar22;
  ulong uVar23;
  long lVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  uint uVar29;
  Aig_Obj_t *local_50;
  
  uVar29 = aigPoIndicesArg->attrPendingSignalIndex;
  iVar25 = aigPoIndicesArg->attrHintSingalBeginningMarker;
  vKnownMonotone = monotoneVectorArg->attrKnownMonotone;
  vCandMonotone = monotoneVectorArg->attrCandMonotone;
  vHintMonotone = monotoneVectorArg->attrHintMonotone;
  p = Aig_ManStart(pAig->vObjs->nSize);
  sVar5 = strlen(pAig->pName);
  __s = (char *)malloc(sVar5 + 10);
  p->pName = __s;
  iVar28 = 0;
  sprintf(__s,"%s_%s",pAig->pName,"_monotone");
  p->pSpec = (char *)0x0;
  pAig->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p->pConst1;
  if (0 < pAig->nTruePis) {
    lVar21 = 0;
    do {
      if (pAig->vCis->nSize <= lVar21) goto LAB_005af5cb;
      pvVar8 = pAig->vCis->pArray[lVar21];
      pAVar6 = Aig_ObjCreateCi(p);
      *(Aig_Obj_t **)((long)pvVar8 + 0x28) = pAVar6;
      lVar21 = lVar21 + 1;
    } while (lVar21 < pAig->nTruePis);
  }
  if (0 < pAig->nRegs) {
    iVar28 = 0;
    do {
      uVar4 = pAig->nTruePis + iVar28;
      if (((int)uVar4 < 0) || (pAig->vCis->nSize <= (int)uVar4)) goto LAB_005af5cb;
      pvVar8 = pAig->vCis->pArray[uVar4];
      iVar28 = iVar28 + 1;
      pAVar6 = Aig_ObjCreateCi(p);
      *(Aig_Obj_t **)((long)pvVar8 + 0x28) = pAVar6;
    } while (iVar28 < pAig->nRegs);
  }
  pAVar6 = Aig_ObjCreateCi(p);
  uVar4 = vHintMonotone->nSize;
  puVar7 = (uint *)malloc(0x10);
  uVar16 = 8;
  if (6 < uVar4 - 1) {
    uVar16 = uVar4;
  }
  puVar7[1] = 0;
  *puVar7 = uVar16;
  if (uVar16 == 0) {
    pvVar8 = (void *)0x0;
  }
  else {
    pvVar8 = malloc((long)(int)uVar16 << 3);
  }
  *(void **)(puVar7 + 2) = pvVar8;
  if (vHintMonotone->nSize < 1) {
    iVar27 = 1;
  }
  else {
    iVar26 = 0;
    do {
      iVar27 = iVar26;
      pAVar9 = Aig_ObjCreateCi(p);
      uVar4 = puVar7[1];
      uVar16 = *puVar7;
      if (uVar4 == uVar16) {
        if ((int)uVar16 < 0x10) {
          if (*(void **)(puVar7 + 2) == (void *)0x0) {
            pvVar8 = malloc(0x80);
          }
          else {
            pvVar8 = realloc(*(void **)(puVar7 + 2),0x80);
          }
          uVar22 = 0x10;
        }
        else {
          uVar22 = uVar16 * 2;
          if ((int)uVar22 <= (int)uVar16) goto LAB_005aedde;
          if (*(void **)(puVar7 + 2) == (void *)0x0) {
            pvVar8 = malloc((ulong)uVar16 << 4);
          }
          else {
            pvVar8 = realloc(*(void **)(puVar7 + 2),(ulong)uVar16 << 4);
          }
        }
        *(void **)(puVar7 + 2) = pvVar8;
        *puVar7 = uVar22;
      }
LAB_005aedde:
      puVar7[1] = uVar4 + 1;
      *(Aig_Obj_t **)(*(long *)(puVar7 + 2) + (long)(int)uVar4 * 8) = pAVar9;
      iVar26 = iVar27 + 1;
    } while (iVar26 < vHintMonotone->nSize);
    iVar27 = iVar27 + 2;
  }
  uVar4 = iVar27 + iVar28;
  printf("\nnRegCount = %d\n",(ulong)uVar4);
  pVVar10 = pAig->vObjs;
  if (0 < pVVar10->nSize) {
    lVar21 = 0;
    do {
      pvVar8 = pVVar10->pArray[lVar21];
      if ((pvVar8 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar8 + 0x18) & 7) - 7)) {
        if (((ulong)pvVar8 & 1) != 0) goto LAB_005af5ea;
        uVar11 = *(ulong *)((long)pvVar8 + 8) & 0xfffffffffffffffe;
        if (uVar11 == 0) {
          pAVar9 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar9 = (Aig_Obj_t *)
                   ((ulong)((uint)*(ulong *)((long)pvVar8 + 8) & 1) ^ *(ulong *)(uVar11 + 0x28));
        }
        uVar11 = *(ulong *)((long)pvVar8 + 0x10) & 0xfffffffffffffffe;
        if (uVar11 == 0) {
          pAVar18 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar18 = (Aig_Obj_t *)
                    ((ulong)((uint)*(ulong *)((long)pvVar8 + 0x10) & 1) ^ *(ulong *)(uVar11 + 0x28))
          ;
        }
        pAVar9 = Aig_And(p,pAVar9,pAVar18);
        *(Aig_Obj_t **)((long)pvVar8 + 0x28) = pAVar9;
      }
      lVar21 = lVar21 + 1;
      pVVar10 = pAig->vObjs;
    } while (lVar21 < pVVar10->nSize);
  }
  if ((-1 < (int)uVar29) && ((int)uVar29 < pAig->vCos->nSize)) {
    uVar11 = *(ulong *)((long)pAig->vCos->pArray[uVar29] + 8);
    if ((uVar11 & 1) == 0) {
      pAVar9 = *(Aig_Obj_t **)(uVar11 + 0x28);
    }
    else {
      pAVar9 = (Aig_Obj_t *)(*(ulong *)((uVar11 & 0xfffffffffffffffe) + 0x28) ^ 1);
    }
    local_50 = Aig_And(p,pAVar9,pAVar6);
    if (vKnownMonotone != (Vec_Int_t *)0x0) {
      iVar28 = pAig->nRegs;
      iVar27 = pAig->nObjs[3];
      pAVar6 = p->pConst1;
      checkSanityOfKnownMonotone(vKnownMonotone,vCandMonotone,vHintMonotone);
      if (0 < vKnownMonotone->nSize) {
        iVar25 = (uVar29 - iVar25) + 1;
        lVar21 = 0;
        do {
          iVar26 = vKnownMonotone->pArray[lVar21];
          printf("\nProcessing knownMonotone = %d\n",(ulong)(uint)(iVar25 + iVar26));
          uVar29 = iVar26 + iVar25;
          if (((int)uVar29 < 0) || (pAig->vCos->nSize <= (int)uVar29)) goto LAB_005af5cb;
          uVar11 = *(ulong *)((long)pAig->vCos->pArray[uVar29] + 8);
          if ((uVar11 & 1) == 0) {
            pAVar18 = *(Aig_Obj_t **)(uVar11 + 0x28);
          }
          else {
            pAVar18 = (Aig_Obj_t *)(*(ulong *)((uVar11 & 0xfffffffffffffffe) + 0x28) ^ 1);
          }
          uVar29 = uVar29 + (iVar28 - iVar27);
          if (((int)uVar29 < 0) || ((int)puVar7[1] <= (int)uVar29)) goto LAB_005af5cb;
          p1 = *(Aig_Obj_t **)(*(long *)(puVar7 + 2) + (ulong)uVar29 * 8);
          p0 = Aig_And(p,pAVar18,p1);
          pAVar18 = Aig_And(p,(Aig_Obj_t *)((ulong)pAVar18 ^ 1),(Aig_Obj_t *)((ulong)p1 ^ 1));
          pAVar18 = Aig_Or(p,p0,pAVar18);
          pAVar6 = Aig_And(p,pAVar6,pAVar18);
          lVar21 = lVar21 + 1;
        } while (lVar21 < vKnownMonotone->nSize);
      }
      local_50 = Aig_And(p,local_50,pAVar6);
    }
    uVar29 = vHintMonotone->nSize;
    puVar12 = (uint *)malloc(0x10);
    uVar16 = 8;
    if (6 < uVar29 - 1) {
      uVar16 = uVar29;
    }
    puVar12[1] = 0;
    *puVar12 = uVar16;
    if (uVar16 == 0) {
      pvVar8 = (void *)0x0;
    }
    else {
      pvVar8 = malloc((long)(int)uVar16 * 8);
    }
    *(void **)(puVar12 + 2) = pvVar8;
    puVar13 = (uint *)malloc(0x10);
    puVar13[1] = 0;
    *puVar13 = uVar16;
    if (uVar16 == 0) {
      pvVar8 = (void *)0x0;
    }
    else {
      pvVar8 = malloc((long)(int)uVar16 << 3);
    }
    puVar1 = puVar12 + 1;
    puVar19 = puVar12 + 2;
    puVar2 = puVar13 + 1;
    puVar20 = puVar13 + 2;
    *(void **)(puVar13 + 2) = pvVar8;
    uVar11 = (ulong)(uint)vHintMonotone->nSize;
    if (0 < vHintMonotone->nSize) {
      lVar21 = 0;
      do {
        iVar25 = vHintMonotone->pArray[lVar21];
        if (((long)iVar25 < 0) || (pAig->vCos->nSize <= iVar25)) goto LAB_005af5cb;
        uVar23 = *(ulong *)((long)pAig->vCos->pArray[iVar25] + 8);
        if ((uVar23 & 1) == 0) {
          pAVar6 = *(Aig_Obj_t **)(uVar23 + 0x28);
        }
        else {
          pAVar6 = (Aig_Obj_t *)(*(ulong *)((uVar23 & 0xfffffffffffffffe) + 0x28) ^ 1);
        }
        if ((vKnownMonotone != (Vec_Int_t *)0x0) && (0 < (long)vKnownMonotone->nSize)) {
          lVar24 = 0;
          do {
            if (vKnownMonotone->pArray[lVar24] == iVar25) {
              uVar29 = *puVar12;
              uVar16 = puVar12[1];
              puVar14 = puVar19;
              puVar17 = puVar1;
              pAVar18 = pAVar6;
              if (uVar16 != uVar29) goto LAB_005af34b;
              if ((int)uVar29 < 0x10) {
                if (*(void **)puVar19 == (void *)0x0) {
                  pvVar8 = malloc(0x80);
                }
                else {
                  pvVar8 = realloc(*(void **)puVar19,0x80);
                }
                uVar22 = 0x10;
              }
              else {
                uVar22 = uVar29 * 2;
                if ((int)uVar22 <= (int)uVar29) goto LAB_005af34b;
                if (*(void **)puVar19 == (void *)0x0) {
                  pvVar8 = malloc((ulong)uVar29 << 4);
                }
                else {
                  pvVar8 = realloc(*(void **)puVar19,(ulong)uVar29 << 4);
                }
              }
              *(void **)(puVar12 + 2) = pvVar8;
              *puVar12 = uVar22;
              goto LAB_005af34b;
            }
            lVar24 = lVar24 + 1;
          } while (vKnownMonotone->nSize != lVar24);
        }
        uVar29 = 0xffffffff;
        if (0 < (int)uVar11) {
          uVar23 = 0;
          do {
            if (vHintMonotone->pArray[uVar23] == iVar25) {
              uVar29 = (uint)uVar23;
              break;
            }
            uVar23 = uVar23 + 1;
          } while ((uVar11 & 0xffffffff) != uVar23);
        }
        if (((int)uVar29 < 0) || ((int)puVar7[1] <= (int)uVar29)) goto LAB_005af5cb;
        pAVar18 = Aig_And(p,local_50,*(Aig_Obj_t **)(*(long *)(puVar7 + 2) + (ulong)uVar29 * 8));
        pAVar18 = Aig_Or(p,(Aig_Obj_t *)((ulong)pAVar18 ^ 1),pAVar6);
        uVar29 = puVar12[1];
        uVar16 = *puVar12;
        if (uVar29 == uVar16) {
          if ((int)uVar16 < 0x10) {
            if (*(void **)puVar19 == (void *)0x0) {
              pvVar8 = malloc(0x80);
            }
            else {
              pvVar8 = realloc(*(void **)puVar19,0x80);
            }
            uVar22 = 0x10;
          }
          else {
            uVar22 = uVar16 * 2;
            if ((int)uVar22 <= (int)uVar16) goto LAB_005af2a1;
            if (*(void **)puVar19 == (void *)0x0) {
              pvVar8 = malloc((ulong)uVar16 << 4);
            }
            else {
              pvVar8 = realloc(*(void **)puVar19,(ulong)uVar16 << 4);
            }
          }
          *(void **)(puVar12 + 2) = pvVar8;
          *puVar12 = uVar22;
        }
LAB_005af2a1:
        *puVar1 = uVar29 + 1;
        *(Aig_Obj_t **)(*(long *)puVar19 + (long)(int)uVar29 * 8) = pAVar6;
        uVar29 = *puVar13;
        uVar16 = puVar13[1];
        puVar14 = puVar20;
        puVar17 = puVar2;
        if (uVar16 == uVar29) {
          if ((int)uVar29 < 0x10) {
            if (*(void **)puVar20 == (void *)0x0) {
              pvVar8 = malloc(0x80);
            }
            else {
              pvVar8 = realloc(*(void **)puVar20,0x80);
            }
            uVar22 = 0x10;
          }
          else {
            uVar22 = uVar29 * 2;
            if ((int)uVar22 <= (int)uVar29) goto LAB_005af34b;
            if (*(void **)puVar20 == (void *)0x0) {
              pvVar8 = malloc((ulong)uVar29 << 4);
            }
            else {
              pvVar8 = realloc(*(void **)puVar20,(ulong)uVar29 << 4);
            }
          }
          *(void **)(puVar13 + 2) = pvVar8;
          *puVar13 = uVar22;
        }
LAB_005af34b:
        lVar24 = *(long *)puVar14;
        *puVar17 = uVar16 + 1;
        *(Aig_Obj_t **)(lVar24 + (long)(int)uVar16 * 8) = pAVar18;
        lVar21 = lVar21 + 1;
        uVar11 = (ulong)vHintMonotone->nSize;
      } while (lVar21 < (long)uVar11);
    }
    uVar11 = 0;
    iVar25 = 0;
    if (0 < pAig->nTruePos) {
      uVar11 = 0;
      do {
        if ((long)pAig->vCos->nSize <= (long)uVar11) goto LAB_005af5cb;
        pvVar8 = pAig->vCos->pArray[uVar11];
        if (((ulong)pvVar8 & 1) != 0) goto LAB_005af5ea;
        uVar23 = *(ulong *)((long)pvVar8 + 8) & 0xfffffffffffffffe;
        if (uVar23 == 0) {
          pAVar6 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar6 = (Aig_Obj_t *)
                   ((ulong)((uint)*(ulong *)((long)pvVar8 + 8) & 1) ^ *(ulong *)(uVar23 + 0x28));
        }
        uVar11 = uVar11 + 1;
        pAVar6 = Aig_ObjCreateCo(p,pAVar6);
        *(Aig_Obj_t **)((long)pvVar8 + 0x28) = pAVar6;
      } while ((long)uVar11 < (long)pAig->nTruePos);
      iVar25 = (int)uVar11;
    }
    *startMonotonePropPo = iVar25;
    uVar29 = *puVar2;
    uVar16 = 0;
    if (0 < (long)(int)uVar29) {
      lVar21 = *(long *)puVar20;
      lVar24 = 0;
      do {
        lVar3 = lVar24 * 8;
        lVar24 = lVar24 + 1;
        Aig_ObjCreateCo(p,*(Aig_Obj_t **)(lVar21 + lVar3));
        uVar16 = uVar29;
      } while ((int)uVar29 != lVar24);
    }
    if (pAig->nRegs < 1) {
      iVar25 = 0;
    }
    else {
      iVar25 = 0;
      do {
        uVar29 = pAig->nTruePos + iVar25;
        if (((int)uVar29 < 0) || (pAig->vCos->nSize <= (int)uVar29)) goto LAB_005af5cb;
        pvVar8 = pAig->vCos->pArray[uVar29];
        if (((ulong)pvVar8 & 1) != 0) {
LAB_005af5ea:
          __assert_fail("!Aig_IsComplement(pObj)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aig.h"
                        ,0x138,"Aig_Obj_t *Aig_ObjChild0Copy(Aig_Obj_t *)");
        }
        uVar23 = *(ulong *)((long)pvVar8 + 8);
        uVar15 = uVar23 & 0xfffffffffffffffe;
        if (uVar15 == 0) {
          pAVar6 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar6 = (Aig_Obj_t *)((ulong)((uint)uVar23 & 1) ^ *(ulong *)(uVar15 + 0x28));
        }
        iVar25 = iVar25 + 1;
        Aig_ObjCreateCo(p,pAVar6);
      } while (iVar25 < pAig->nRegs);
    }
    Aig_ObjCreateCo(p,pAVar9);
    uVar29 = *puVar1;
    if ((long)(int)uVar29 < 1) {
      uVar29 = 1;
    }
    else {
      lVar21 = *(long *)puVar19;
      lVar24 = 0;
      do {
        Aig_ObjCreateCo(p,*(Aig_Obj_t **)(lVar21 + lVar24 * 8));
        lVar24 = lVar24 + 1;
      } while ((int)uVar29 != lVar24);
      uVar29 = uVar29 + 1;
    }
    printf("\npoCopied = %d, poCreated = %d\n",uVar11 & 0xffffffff,(ulong)uVar16);
    printf("\nliCreated++ = %d\n",(ulong)uVar29);
    Aig_ManSetRegNum(p,uVar4);
    Aig_ManCleanup(p);
    iVar28 = Aig_ManCheck(p);
    if (iVar28 == 0) {
      __assert_fail("Aig_ManCheck( pNewAig )",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/live/monotone.c"
                    ,0x154,
                    "Aig_Man_t *createMonotoneTester(Aig_Man_t *, struct aigPoIndices *, struct monotoneVectorsStruct *, int *)"
                   );
    }
    if (uVar4 != uVar29 + iVar25) {
      __assert_fail("loCopied + loCreated == liCopied + liCreated",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/live/monotone.c"
                    ,0x155,
                    "Aig_Man_t *createMonotoneTester(Aig_Man_t *, struct aigPoIndices *, struct monotoneVectorsStruct *, int *)"
                   );
    }
    printf("\nSaig_ManPoNum = %d\n",(ulong)(uint)p->nTruePos);
    return p;
  }
LAB_005af5cb:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

Aig_Man_t *createMonotoneTester(Aig_Man_t *pAig, struct aigPoIndices *aigPoIndicesArg, struct monotoneVectorsStruct *monotoneVectorArg, int *startMonotonePropPo)
{
	Aig_Man_t *pNewAig;
	int iElem, i, nRegCount, oldPoNum, poSerialNum, iElemHint;
	int piCopied = 0, liCopied = 0, liCreated = 0, loCopied = 0, loCreated = 0;
	int poCopied = 0, poCreated = 0;
	Aig_Obj_t *pObj, *pObjPo, *pObjDriver, *pObjDriverNew, *pObjPendingDriverNew, *pObjPendingAndNextPending;
	Aig_Obj_t *pPendingFlop, *pHintSignalLo, *pHintMonotoneFlop, *pObjTemp1, *pObjTemp2, *pObjKnownMonotoneAnd;
	Vec_Ptr_t *vHintMonotoneLocalDriverNew;
	Vec_Ptr_t *vHintMonotoneLocalFlopOutput;
	Vec_Ptr_t *vHintMonotoneLocalProp;

	int pendingSignalIndexLocal = aigPoIndicesArg->attrPendingSignalIndex;
	int hintSingalBeginningMarkerLocal = aigPoIndicesArg->attrHintSingalBeginningMarker;
	//int hintSingalEndMarkerLocal = aigPoIndicesArg->attrHintSingalEndMarker;

	Vec_Int_t *vKnownMonotoneLocal = monotoneVectorArg->attrKnownMonotone;
	Vec_Int_t *vCandMonotoneLocal = monotoneVectorArg->attrCandMonotone;
	Vec_Int_t *vHintMonotoneLocal = monotoneVectorArg->attrHintMonotone;
	
	//****************************************************************
	// Step1: create the new manager
	// Note: The new manager is created with "2 * Aig_ManObjNumMax(p)"
	// nodes, but this selection is arbitrary - need to be justified
	//****************************************************************
	pNewAig = Aig_ManStart( Aig_ManObjNumMax(pAig) );
	pNewAig->pName = (char *)malloc( strlen( pAig->pName ) + strlen("_monotone") + 1 );
	sprintf(pNewAig->pName, "%s_%s", pAig->pName, "_monotone");
    	pNewAig->pSpec = NULL;

	//****************************************************************
	// Step 2: map constant nodes
	//****************************************************************
    	pObj = Aig_ManConst1( pAig );
    	pObj->pData = Aig_ManConst1( pNewAig );

	//****************************************************************
    	// Step 3: create true PIs
	//****************************************************************
    	Saig_ManForEachPi( pAig, pObj, i )
	{
		piCopied++;
		pObj->pData = Aig_ObjCreateCi(pNewAig);
	}

	//****************************************************************
	// Step 5: create register outputs
	//****************************************************************
    	Saig_ManForEachLo( pAig, pObj, i )
    	{
		loCopied++;
		pObj->pData = Aig_ObjCreateCi(pNewAig);
    	}

	//****************************************************************
	// Step 6: create "D" register output for PENDING flop 
	//****************************************************************
	loCreated++;
	pPendingFlop = Aig_ObjCreateCi( pNewAig );

	//****************************************************************
	// Step 6.a: create "D" register output for HINT_MONOTONE flop 
	//****************************************************************
	vHintMonotoneLocalFlopOutput = Vec_PtrAlloc(Vec_IntSize(vHintMonotoneLocal));
	Vec_IntForEachEntry( vHintMonotoneLocal, iElem, i )
	{
		loCreated++;
		pHintMonotoneFlop = Aig_ObjCreateCi( pNewAig );
		Vec_PtrPush( vHintMonotoneLocalFlopOutput, pHintMonotoneFlop );
	}

	nRegCount = loCreated + loCopied;
	printf("\nnRegCount = %d\n", nRegCount);

	//********************************************************************
	// Step 7: create internal nodes
	//********************************************************************
    	Aig_ManForEachNode( pAig, pObj, i )
	{
		pObj->pData = Aig_And( pNewAig, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
	}
	
	//********************************************************************
	// Step 8: mapping appropriate new flop drivers 
	//********************************************************************

	pObjPo = Aig_ManCo( pAig, pendingSignalIndexLocal );
	pObjDriver = Aig_NotCond((Aig_Obj_t *)Aig_ObjFanin0(pObjPo), Aig_ObjFaninC0(pObjPo));
	pObjPendingDriverNew = !Aig_IsComplement(pObjDriver)? 
				(Aig_Obj_t *)(Aig_Regular(pObjDriver)->pData) : 
				Aig_Not((Aig_Obj_t *)(Aig_Regular(pObjDriver)->pData));

	pObjPendingAndNextPending = Aig_And( pNewAig, pObjPendingDriverNew, pPendingFlop );

	oldPoNum = Aig_ManCoNum(pAig) - Aig_ManRegNum(pAig);
	pObjKnownMonotoneAnd = Aig_ManConst1( pNewAig );
	#if 1
	if( vKnownMonotoneLocal )
	{
		assert( checkSanityOfKnownMonotone( vKnownMonotoneLocal, vCandMonotoneLocal, vHintMonotoneLocal ) );

		Vec_IntForEachEntry( vKnownMonotoneLocal, iElemHint, i )
		{
			iElem = (iElemHint - hintSingalBeginningMarkerLocal) + 1 + pendingSignalIndexLocal;
			printf("\nProcessing knownMonotone = %d\n", iElem);
			pObjPo = Aig_ManCo( pAig, iElem );
			pObjDriver = Aig_NotCond((Aig_Obj_t *)Aig_ObjFanin0(pObjPo), Aig_ObjFaninC0(pObjPo));
			pObjDriverNew = !Aig_IsComplement(pObjDriver)? 
					(Aig_Obj_t *)(Aig_Regular(pObjDriver)->pData) : 
					Aig_Not((Aig_Obj_t *)(Aig_Regular(pObjDriver)->pData));
			pHintSignalLo = (Aig_Obj_t *)Vec_PtrEntry(vHintMonotoneLocalFlopOutput, iElem - oldPoNum);
			pObjTemp1 = Aig_Or( pNewAig, Aig_And(pNewAig, pObjDriverNew, pHintSignalLo), 
						Aig_And(pNewAig, Aig_Not(pObjDriverNew), Aig_Not(pHintSignalLo)) );
			
			pObjKnownMonotoneAnd = Aig_And( pNewAig, pObjKnownMonotoneAnd, pObjTemp1 );
		}
		pObjPendingAndNextPending = Aig_And( pNewAig, pObjPendingAndNextPending, pObjKnownMonotoneAnd );
	}
	#endif

	vHintMonotoneLocalDriverNew = Vec_PtrAlloc(Vec_IntSize(vHintMonotoneLocal));
	vHintMonotoneLocalProp = Vec_PtrAlloc(Vec_IntSize(vHintMonotoneLocal));
	Vec_IntForEachEntry( vHintMonotoneLocal, iElem, i )
	{
		pObjPo = Aig_ManCo( pAig, iElem );
		pObjDriver = Aig_NotCond((Aig_Obj_t *)Aig_ObjFanin0(pObjPo), Aig_ObjFaninC0(pObjPo));
		pObjDriverNew = !Aig_IsComplement(pObjDriver)? 
				(Aig_Obj_t *)(Aig_Regular(pObjDriver)->pData) : 
				Aig_Not((Aig_Obj_t *)(Aig_Regular(pObjDriver)->pData));

		if( vKnownMonotoneLocal != NULL && Vec_IntFind( vKnownMonotoneLocal, iElem ) != -1 )
		{
			Vec_PtrPush(vHintMonotoneLocalDriverNew, pObjDriverNew);
		}
		else
		{
			poSerialNum = Vec_IntFind( vHintMonotoneLocal, iElem );
			pHintSignalLo = (Aig_Obj_t *)Vec_PtrEntry(vHintMonotoneLocalFlopOutput, poSerialNum );
			pObjTemp1 = Aig_And( pNewAig, pObjPendingAndNextPending, pHintSignalLo);
			pObjTemp2 = Aig_Or( pNewAig, Aig_Not(pObjTemp1), pObjDriverNew );
			//pObjTemp2 = Aig_Or( pNewAig, Aig_Not(pObjTemp1), Aig_ManConst1( pNewAig ));
			//pObjTemp2 = Aig_ManConst1( pNewAig );
			Vec_PtrPush(vHintMonotoneLocalDriverNew, pObjDriverNew);
			Vec_PtrPush(vHintMonotoneLocalProp, pObjTemp2); 
		}
	}

	//********************************************************************
	// Step 9: create primary outputs 
	//********************************************************************
	Saig_ManForEachPo( pAig, pObj, i )
	{
		poCopied++;
		pObj->pData = Aig_ObjCreateCo( pNewAig, Aig_ObjChild0Copy(pObj) ); 
	}

	*startMonotonePropPo = i;
	Vec_PtrForEachEntry( Aig_Obj_t *, vHintMonotoneLocalProp, pObj, i )
	{
		poCreated++;
		pObjPo = Aig_ObjCreateCo( pNewAig, pObj ); 
	}

	//********************************************************************
	// Step 9: create latch inputs 
	//********************************************************************

	Saig_ManForEachLi( pAig, pObj, i )
	{
		liCopied++;
		Aig_ObjCreateCo( pNewAig, Aig_ObjChild0Copy(pObj) );
	}
	
	//********************************************************************
	// Step 9.a: create latch input for PENDING_FLOP
	//********************************************************************

	liCreated++;
	Aig_ObjCreateCo( pNewAig, pObjPendingDriverNew );

	//********************************************************************
	// Step 9.b: create latch input for MONOTONE_FLOP
	//********************************************************************

	Vec_PtrForEachEntry( Aig_Obj_t *, vHintMonotoneLocalDriverNew, pObj, i )
	{
		liCreated++;
		Aig_ObjCreateCo( pNewAig, pObj );
	}

	printf("\npoCopied = %d, poCreated = %d\n", poCopied, poCreated);
	printf("\nliCreated++ = %d\n", liCreated );
	Aig_ManSetRegNum( pNewAig, nRegCount );
	Aig_ManCleanup( pNewAig );
	
	assert( Aig_ManCheck( pNewAig ) );
	assert( loCopied + loCreated == liCopied + liCreated );

	printf("\nSaig_ManPoNum = %d\n", Saig_ManPoNum(pNewAig));
	return pNewAig;
}